

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineInputFile::rawPixelData
          (DeepScanLineInputFile *this,int firstScanLine,char *pixelData,Int64 *pixelDataSize)

{
  unsigned_long uVar1;
  IStream *pIVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  InputExc *pIVar9;
  ostream *poVar10;
  ArgExc *this_00;
  Data *pDVar11;
  Lock local_1c8;
  stringstream _iex_throw_s;
  undefined4 uStack_1b4;
  ostream local_1a8 [376];
  
  iVar5 = lineBufferMinY(firstScanLine,this->_data->minY,this->_data->linesInBuffer);
  pDVar11 = this->_data;
  iVar6 = (iVar5 - pDVar11->minY) / pDVar11->linesInBuffer;
  uVar1 = (pDVar11->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar6];
  if (uVar1 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar10 = std::operator<<(local_1a8,"Scan line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
    std::operator<<(poVar10," is missing.");
    pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar9,(stringstream *)&_iex_throw_s);
    __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  local_1c8._mutex = &pDVar11->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  iVar7 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  pDVar11 = this->_data;
  if (CONCAT44(extraout_var,iVar7) !=
      (pDVar11->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar6]) {
    pIVar2 = pDVar11->_streamData->is;
    (*pIVar2->_vptr_IStream[6])(pIVar2,uVar1);
    pDVar11 = this->_data;
  }
  if ((pDVar11->version & 0x1000) != 0) {
    pIVar2 = pDVar11->_streamData->is;
    (*pIVar2->_vptr_IStream[3])(pIVar2,&_iex_throw_s,4);
    pDVar11 = this->_data;
    if (__iex_throw_s != pDVar11->partNumber) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar10 = std::operator<<(local_1a8,"Unexpected part number ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,__iex_throw_s);
      poVar10 = std::operator<<(poVar10,", should be ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->_data->partNumber);
      std::operator<<(poVar10,".");
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
      __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  pIVar2 = pDVar11->_streamData->is;
  (*pIVar2->_vptr_IStream[3])(pIVar2,&_iex_throw_s,4);
  if (__iex_throw_s == iVar5) {
    pIVar2 = this->_data->_streamData->is;
    (*pIVar2->_vptr_IStream[3])(pIVar2,&_iex_throw_s,8);
    iVar6 = __iex_throw_s;
    lVar4 = CONCAT44(uStack_1b4,__iex_throw_s);
    pIVar2 = this->_data->_streamData->is;
    (*pIVar2->_vptr_IStream[3])(pIVar2,&_iex_throw_s,8);
    uVar8 = lVar4 + CONCAT44(uStack_1b4,__iex_throw_s) + 0x1c;
    uVar3 = *pixelDataSize;
    *pixelDataSize = uVar8;
    if ((pixelData != (char *)0x0) && (uVar8 <= uVar3)) {
      *(int *)pixelData = iVar5;
      *(long *)(pixelData + 4) = lVar4;
      *(long *)(pixelData + 0xc) = CONCAT44(uStack_1b4,__iex_throw_s);
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                (this->_data->_streamData->is,(unsigned_long *)(pixelData + 0x14));
      pIVar2 = this->_data->_streamData->is;
      (*pIVar2->_vptr_IStream[3])(pIVar2,pixelData + 0x1c,(ulong)(uint)(__iex_throw_s + iVar6));
    }
    pDVar11 = this->_data;
    if (((pDVar11->version & 0x1000) == 0) && (pDVar11->nextLineBufferMinY == iVar5)) {
      pIVar2 = pDVar11->_streamData->is;
      (*pIVar2->_vptr_IStream[6])(pIVar2,uVar1);
    }
    IlmThread_2_5::Lock::~Lock(&local_1c8);
    return;
  }
  pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar9,"Unexpected data block y coordinate.");
  __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
DeepScanLineInputFile::rawPixelData (int firstScanLine,
                                     char *pixelData,
                                     Int64 &pixelDataSize)
{
   
    
    int minY = lineBufferMinY
    (firstScanLine, _data->minY, _data->linesInBuffer);
    int lineBufferNumber = (minY - _data->minY) / _data->linesInBuffer;
    
    Int64 lineOffset = _data->lineOffsets[lineBufferNumber];
    
    if (lineOffset == 0)
        THROW (IEX_NAMESPACE::InputExc, "Scan line " << minY << " is missing.");
    
    
    // enter the lock here - prevent another thread reseeking the file during read
    Lock lock (*_data->_streamData);
    
    //
    // Seek to the start of the scan line in the file,
    //
    
    if (_data->_streamData->is->tellg() != _data->lineOffsets[lineBufferNumber])
        _data->_streamData->is->seekg (lineOffset);
    
    //
    // Read the data block's header.
    //
    
    int yInFile;
    
    //
    // Read the part number when we are dealing with a multi-part file.
    //
    
    if (isMultiPart(_data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, partNumber);
        if (partNumber != _data->partNumber)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Unexpected part number " << partNumber
            << ", should be " << _data->partNumber << ".");
        }
    }
    
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, yInFile);
    
    if (yInFile != minY)
        throw IEX_NAMESPACE::InputExc ("Unexpected data block y coordinate.");
    
    Int64 sampleCountTableSize;
    Int64 packedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, sampleCountTableSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*_data->_streamData->is, packedDataSize);
    
    // total requirement for reading all the data
    
    Int64 totalSizeRequired=28+sampleCountTableSize+packedDataSize;
    
    bool big_enough = totalSizeRequired<=pixelDataSize;
    
    pixelDataSize = totalSizeRequired;
    
    // was the block we were given big enough?
    if(!big_enough || pixelData==NULL)
    {        
        // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
        // in single part files)
        if(!isMultiPart(_data->version))
        {
          if (_data->nextLineBufferMinY == minY)
              _data->_streamData->is->seekg (lineOffset);
        }
        // leave lock here - bail before reading more data
        return;
    }
    
    // copy the values we have read into the output block
    *(int *) pixelData = yInFile;
    *(Int64 *) (pixelData+4) =sampleCountTableSize;
    *(Int64 *) (pixelData+12) = packedDataSize;
    
    // didn't read the unpackedsize - do that now
    Xdr::read<StreamIO> (*_data->_streamData->is, *(Int64 *) (pixelData+20));
    
    // read the actual data
    _data->_streamData->is->read(pixelData+28, sampleCountTableSize+packedDataSize);
    
    // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
    // in single part files)
    if(!isMultiPart(_data->version))
    {
        if (_data->nextLineBufferMinY == minY)
            _data->_streamData->is->seekg (lineOffset);
    }
    
    // leave lock here
    
}